

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O3

SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
absl::lts_20240722::strings_internal::
SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
::operator++(SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *this)

{
  size_t sVar1;
  ulong uVar2;
  SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *pSVar3;
  ulong uVar4;
  Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *extraout_RDX;
  SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *unaff_RBX;
  State SVar5;
  char *pcVar6;
  ulong unaff_R14;
  char *unaff_R15;
  undefined1 auVar7 [16];
  
  while( true ) {
    *(char **)((long)register0x00000020 + -8) = unaff_R15;
    *(ulong *)((long)register0x00000020 + -0x10) = unaff_R14;
    *(SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      **)((long)register0x00000020 + -0x18) = unaff_RBX;
    if (this->state_ == kLastState) {
      this->state_ = kEndState;
      return this;
    }
    sVar1 = this->pos_;
    unaff_R14 = (this->splitter_->text_)._M_len;
    unaff_R15 = (this->splitter_->text_)._M_str;
    *(undefined8 *)((long)register0x00000020 + -0x20) = 0x10a44c;
    auVar7 = absl::lts_20240722::ByChar::Find(&this->delimiter_,unaff_R14,unaff_R15,sVar1);
    if (auVar7._8_8_ == unaff_R15 + unaff_R14) {
      this->state_ = kLastState;
    }
    uVar2 = this->pos_;
    if (uVar2 <= unaff_R14) {
      uVar4 = (long)auVar7._8_8_ - (long)(unaff_R15 + uVar2);
      if (unaff_R14 - uVar2 < uVar4) {
        uVar4 = unaff_R14 - uVar2;
      }
      (this->curr_)._M_len = uVar4;
      (this->curr_)._M_str = unaff_R15 + uVar2;
      this->pos_ = auVar7._0_8_ + uVar2 + uVar4;
      return this;
    }
    pcVar6 = "%s: __pos (which is %zu) > __size (which is %zu)";
    SVar5 = 0x12f057;
    *(undefined8 *)((long)register0x00000020 + -0x20) = 0x10a4a9;
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar2,
               unaff_R14);
    ((SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      *)pcVar6)->pos_ = 0;
    ((SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      *)pcVar6)->state_ = SVar5;
    (((SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
       *)pcVar6)->curr_)._M_len = 0;
    (((SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
       *)pcVar6)->curr_)._M_str = (char *)0x0;
    ((SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      *)pcVar6)->splitter_ = extraout_RDX;
    (((SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
       *)pcVar6)->delimiter_).c_ = (extraout_RDX->delimiter_).c_;
    pSVar3 = (SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)(extraout_RDX->text_)._M_len;
    if ((extraout_RDX->text_)._M_str == (char *)0x0) break;
    unaff_RBX = this;
    register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -0x18);
    this = (SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)pcVar6;
    if (SVar5 == kEndState) {
LAB_0010a4d8:
      ((SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        *)pcVar6)->pos_ = (size_t)pSVar3;
      return pSVar3;
    }
  }
  ((SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    *)pcVar6)->state_ = kEndState;
  goto LAB_0010a4d8;
}

Assistant:

SplitIterator& operator++() {
    do {
      if (state_ == kLastState) {
        state_ = kEndState;
        return *this;
      }
      const absl::string_view text = splitter_->text();
      const absl::string_view d = delimiter_.Find(text, pos_);
      if (d.data() == text.data() + text.size()) state_ = kLastState;
      curr_ = text.substr(pos_,
                          static_cast<size_t>(d.data() - (text.data() + pos_)));
      pos_ += curr_.size() + d.size();
    } while (!predicate_(curr_));
    return *this;
  }